

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSupMin.c
# Opt level: O0

Gia_ManSup_t * Gia_ManSupStart(int nVarsMax)

{
  int iVar1;
  Gia_ManSup_t *pGVar2;
  Vec_Ptr_t *pVVar3;
  Vec_Int_t *pVVar4;
  uint *puVar5;
  Gia_ManSup_t *p;
  int nVarsMax_local;
  
  if (nVarsMax < 0x15) {
    pGVar2 = (Gia_ManSup_t *)calloc(1,0x48);
    pGVar2->nVarsMax = nVarsMax;
    iVar1 = Kit_TruthWordNum(pGVar2->nVarsMax);
    pGVar2->nWordsMax = iVar1;
    pVVar3 = Vec_PtrAllocTruthTables(pGVar2->nVarsMax);
    pGVar2->vTruthVars = pVVar3;
    pVVar3 = Vec_PtrAllocSimInfo(0x200,pGVar2->nWordsMax);
    pGVar2->vTruthNodes = pVVar3;
    pVVar4 = Vec_IntAlloc(0x200);
    pGVar2->vConeCare = pVVar4;
    pVVar4 = Vec_IntAlloc(0x200);
    pGVar2->vConeData = pVVar4;
    puVar5 = (uint *)malloc((long)pGVar2->nWordsMax << 2);
    pGVar2->pTruthIn = puVar5;
    puVar5 = (uint *)malloc((long)pGVar2->nWordsMax << 2);
    pGVar2->pTruthOut = puVar5;
    return pGVar2;
  }
  __assert_fail("nVarsMax <= 20",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSupMin.c"
                ,0x43,"Gia_ManSup_t *Gia_ManSupStart(int)");
}

Assistant:

Gia_ManSup_t * Gia_ManSupStart( int nVarsMax )
{
    Gia_ManSup_t * p;
    assert( nVarsMax <= 20 );
    p = ABC_CALLOC( Gia_ManSup_t, 1 );
    p->nVarsMax    = nVarsMax;
    p->nWordsMax   = Kit_TruthWordNum( p->nVarsMax );
    p->vTruthVars  = Vec_PtrAllocTruthTables( p->nVarsMax );
    p->vTruthNodes = Vec_PtrAllocSimInfo( 512, p->nWordsMax );
    p->vConeCare   = Vec_IntAlloc( 512 );
    p->vConeData   = Vec_IntAlloc( 512 );
    p->pTruthIn    = ABC_ALLOC( unsigned, p->nWordsMax );
    p->pTruthOut   = ABC_ALLOC( unsigned, p->nWordsMax );
    return p;
}